

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O0

bool __thiscall
SGParser::Parse<SGParser::ParseStackGenericElement>::Create
          (Parse<SGParser::ParseStackGenericElement> *this,ParseTable *ptable,size_t stackSize)

{
  size_t sVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  unsigned_long *puVar4;
  ulong uVar5;
  ulong *puVar6;
  ParseStackGenericElement *pPVar7;
  ParseStackGenericElement *this_00;
  ulong uVar8;
  ParseStackGenericElement *local_60;
  void *local_40;
  ParseStackGenericElement *local_38;
  ParseStackGenericElement *newStack;
  unsigned_long newStackSize;
  size_t stackSize_local;
  ParseTable *ptable_local;
  Parse<SGParser::ParseStackGenericElement> *this_local;
  
  newStackSize = stackSize;
  stackSize_local = (size_t)ptable;
  ptable_local = (ParseTable *)this;
  bVar3 = IsValid(this);
  if (bVar3) {
    this_local._7_1_ = false;
  }
  else {
    puVar4 = std::max<unsigned_long>(&MinStackSize,&newStackSize);
    pPVar7 = (ParseStackGenericElement *)*puVar4;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = pPVar7;
    uVar5 = SUB168(auVar2 * ZEXT816(0x40),0);
    uVar8 = uVar5 + 8;
    if (SUB168(auVar2 * ZEXT816(0x40),8) != 0 || 0xfffffffffffffff7 < uVar5) {
      uVar8 = 0xffffffffffffffff;
    }
    newStack = pPVar7;
    puVar6 = (ulong *)operator_new__(uVar8);
    *puVar6 = (ulong)pPVar7;
    local_38 = (ParseStackGenericElement *)(puVar6 + 1);
    if (pPVar7 != (ParseStackGenericElement *)0x0) {
      local_60 = local_38;
      do {
        ParseStackGenericElement::ParseStackGenericElement(local_60);
        local_60 = local_60 + 1;
      } while (local_60 != local_38 + (long)pPVar7);
    }
    local_40 = (void *)0x0;
    puVar4 = std::exchange<unsigned_long*,decltype(nullptr)>
                       (&this->pValidTokenStackPositions,&local_40);
    if (puVar4 != (unsigned_long *)0x0) {
      operator_delete__(puVar4);
    }
    this->pParseTable = (ParseTable *)stackSize_local;
    this->pTokenizer = (TokenStream<SGParser::GenericToken> *)0x0;
    this->TopState = 0xffffffff;
    this->ErrorMarker = 0xffffffffffffffff;
    pPVar7 = std::exchange<SGParser::ParseStackGenericElement*,SGParser::ParseStackGenericElement*&>
                       (&this->pStack,&local_38);
    if (pPVar7 != (ParseStackGenericElement *)0x0) {
      sVar1 = pPVar7[-1].Offset;
      this_00 = pPVar7 + sVar1;
      while (pPVar7 != this_00) {
        this_00 = this_00 + -1;
        ParseStackGenericElement::~ParseStackGenericElement(this_00);
      }
      operator_delete__(&pPVar7[-1].Offset,sVar1 * 0x40 + 8);
    }
    this->StackSize = (size_t)newStack;
    this->StackPosition = 0;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Parse<StackElement>::Create(const ParseTable* ptable, size_t stackSize) {
    // Make sure the parsing process is not started
    // IsValid() is reversed in this context: `this` is valid for Create
    // only if IsValid() is false
    if (IsValid())
        return false;

    // Allocate stack
    // Basic exception safety is provided
    const auto newStackSize = std::max(MinStackSize, stackSize);
    auto       newStack     = new StackElement[newStackSize];

    // From this point we can (safely) initialize the actual data

    delete[] std::exchange(pValidTokenStackPositions, nullptr);

    pParseTable = ptable;
    pTokenizer  = nullptr;
    TopState    = InvalidState;
    ErrorMarker = InvalidIndex;

    // If new stack allocation is successful then modify the existing stack
    delete[] std::exchange(pStack, newStack);
    StackSize     = newStackSize;
    StackPosition = 0u;

    return true;
}